

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O1

void EpdMultiply2(EpDouble *epd1,EpDouble *epd2)

{
  int iVar1;
  EpTypeUnion EVar2;
  
  if ((SUB84(epd1->type,4) >> 0x14 < 0xfff ||
       ((ulong)epd1->type & 0xfffffffffffff) != 0x8000000000000) &&
     (EVar2 = epd2->type,
     ((ulong)EVar2 & 0xfffffffffffff) != 0x8000000000000 || (ulong)EVar2 < 0xfff0000000000000)) {
    if ((((ulong)epd1->type & 0x7fffffffffffffff) != 0x7ff0000000000000) &&
       (((ulong)epd2->type & 0x7fffffffffffffff) != 0x7ff0000000000000)) {
      if (((ulong)epd1->type & 0x7ff0000000000000) != 0x3ff0000000000000) {
        __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/epd/epd.c"
                      ,0x106,"void EpdMultiply2(EpDouble *, EpDouble *)");
      }
      if (((ulong)epd2->type & 0x7ff0000000000000) == 0x3ff0000000000000) {
        iVar1 = epd2->exponent;
        (epd1->type).value = (epd1->type).value * (epd2->type).value;
        epd1->exponent = epd1->exponent + iVar1;
        EpdNormalize(epd1);
        return;
      }
      __assert_fail("epd2->type.bits.exponent == EPD_MAX_BIN",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/epd/epd.c"
                    ,0x107,"void EpdMultiply2(EpDouble *, EpDouble *)");
    }
    epd1->type = (EpTypeUnion)
                 (((ulong)EVar2 ^ (ulong)epd1->type) & 0x8000000000000000 | 0x7ff0000000000000);
  }
  else {
    (epd1->type).value = -NAN;
  }
  epd1->exponent = 0;
  return;
}

Assistant:

void
EpdMultiply2(EpDouble *epd1, EpDouble *epd2)
{
  double        value;
  int           exponent;

  if (EpdIsNan(epd1) || EpdIsNan(epd2)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || EpdIsInf(epd2)) {
    int sign;

    sign = epd1->type.bits.sign ^ epd2->type.bits.sign;
    EpdMakeInf(epd1, sign);
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);
  assert(epd2->type.bits.exponent == EPD_MAX_BIN);

  value = epd1->type.value * epd2->type.value;
  exponent = epd1->exponent + epd2->exponent;
  epd1->type.value = value;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}